

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

GeneratorTracker *
Catch::Generators::GeneratorTracker::acquire(TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  ITracker *pIVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  element_type *peVar5;
  element_type *peVar6;
  int __oflag;
  undefined8 in_RSI;
  char *__file;
  TrackerContext *in_RDI;
  ITrackerPtr childTracker;
  ITrackerPtr thisTracker;
  ITracker *currentTracker;
  shared_ptr<Catch::Generators::GeneratorTracker> tracker;
  NameAndLocation *in_stack_ffffffffffffff08;
  NameAndLocation *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  ITracker **in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  NameAndLocation *in_stack_ffffffffffffff48;
  char local_a0 [16];
  ITracker *local_90;
  char local_78 [16];
  __shared_ptr local_68 [16];
  char local_58 [16];
  __shared_ptr local_48 [32];
  ITracker *local_28;
  undefined8 local_10;
  TrackerContext *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::shared_ptr
            ((shared_ptr<Catch::Generators::GeneratorTracker> *)0x2b2a64);
  local_28 = TestCaseTracking::TrackerContext::currentTracker(local_8);
  TestCaseTracking::ITracker::nameAndLocation(local_28);
  bVar2 = TestCaseTracking::operator==(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (bVar2) {
    iVar3 = (*local_28->_vptr_ITracker[7])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x60))
              (local_48,(long *)CONCAT44(extraout_var,iVar3),local_10);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_48);
    if (!bVar2) {
      __assert_fail("thisTracker",
                    "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/catch.hpp"
                    ,0x3143,
                    "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                   );
    }
    peVar5 = clara::std::
             __shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2b2b44);
    uVar4 = (*peVar5->_vptr_ITracker[0xf])();
    if ((uVar4 & 1) == 0) {
      __assert_fail("thisTracker->isGeneratorTracker()",
                    "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/catch.hpp"
                    ,0x3144,
                    "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                   );
    }
    std::static_pointer_cast<Catch::Generators::GeneratorTracker,Catch::TestCaseTracking::ITracker>
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)
               CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    __file = local_58;
    clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::operator=
              ((shared_ptr<Catch::Generators::GeneratorTracker> *)in_stack_ffffffffffffff10,
               (shared_ptr<Catch::Generators::GeneratorTracker> *)in_stack_ffffffffffffff08);
    clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::~shared_ptr
              ((shared_ptr<Catch::Generators::GeneratorTracker> *)0x2b2bde);
    clara::std::shared_ptr<Catch::TestCaseTracking::ITracker>::~shared_ptr
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)0x2b2beb);
  }
  else {
    (*local_28->_vptr_ITracker[0xc])(local_68,local_28,local_10);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_68);
    if (bVar2) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool(local_68);
      if (!bVar2) {
        __assert_fail("childTracker",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/catch.hpp"
                      ,0x3147,
                      "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                     );
      }
      peVar5 = clara::std::
               __shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2b2c6a);
      uVar4 = (*peVar5->_vptr_ITracker[0xf])();
      if ((uVar4 & 1) == 0) {
        __assert_fail("childTracker->isGeneratorTracker()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/catch.hpp"
                      ,0x3148,
                      "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                     );
      }
      std::
      static_pointer_cast<Catch::Generators::GeneratorTracker,Catch::TestCaseTracking::ITracker>
                ((shared_ptr<Catch::TestCaseTracking::ITracker> *)
                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      __file = local_78;
      clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::operator=
                ((shared_ptr<Catch::Generators::GeneratorTracker> *)in_stack_ffffffffffffff10,
                 (shared_ptr<Catch::Generators::GeneratorTracker> *)in_stack_ffffffffffffff08);
      clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::~shared_ptr
                ((shared_ptr<Catch::Generators::GeneratorTracker> *)0x2b2cf7);
    }
    else {
      local_90 = local_28;
      std::
      make_shared<Catch::Generators::GeneratorTracker,Catch::TestCaseTracking::NameAndLocation_const&,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
                (in_stack_ffffffffffffff48,
                 (TrackerContext *)
                 CONCAT17(in_stack_ffffffffffffff47,
                          CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
                 in_stack_ffffffffffffff38);
      clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::operator=
                ((shared_ptr<Catch::Generators::GeneratorTracker> *)in_stack_ffffffffffffff10,
                 (shared_ptr<Catch::Generators::GeneratorTracker> *)in_stack_ffffffffffffff08);
      clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::~shared_ptr
                ((shared_ptr<Catch::Generators::GeneratorTracker> *)0x2b2d50);
      pIVar1 = local_28;
      __file = local_a0;
      std::shared_ptr<Catch::TestCaseTracking::ITracker>::
      shared_ptr<Catch::Generators::GeneratorTracker,void>
                ((shared_ptr<Catch::TestCaseTracking::ITracker> *)in_stack_ffffffffffffff10,
                 (shared_ptr<Catch::Generators::GeneratorTracker> *)in_stack_ffffffffffffff08);
      (*pIVar1->_vptr_ITracker[0xb])();
      clara::std::shared_ptr<Catch::TestCaseTracking::ITracker>::~shared_ptr
                ((shared_ptr<Catch::TestCaseTracking::ITracker> *)0x2b2d90);
    }
    clara::std::shared_ptr<Catch::TestCaseTracking::ITracker>::~shared_ptr
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)0x2b2dbf);
  }
  peVar6 = clara::std::
           __shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2b2ddd);
  uVar4 = (*(peVar6->super_TrackerBase).super_ITracker._vptr_ITracker[2])();
  if ((uVar4 & 1) == 0) {
    peVar6 = clara::std::
             __shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2b2e06);
    TestCaseTracking::TrackerBase::open(&peVar6->super_TrackerBase,__file,__oflag);
  }
  peVar6 = clara::std::
           __shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_ffffffffffffff10);
  clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::~shared_ptr
            ((shared_ptr<Catch::Generators::GeneratorTracker> *)0x2b2e31);
  return peVar6;
}

Assistant:

static GeneratorTracker& acquire( TrackerContext& ctx, TestCaseTracking::NameAndLocation const& nameAndLocation ) {
                std::shared_ptr<GeneratorTracker> tracker;

                ITracker& currentTracker = ctx.currentTracker();
                // Under specific circumstances, the generator we want
                // to acquire is also the current tracker. If this is
                // the case, we have to avoid looking through current
                // tracker's children, and instead return the current
                // tracker.
                // A case where this check is important is e.g.
                //     for (int i = 0; i < 5; ++i) {
                //         int n = GENERATE(1, 2);
                //     }
                //
                // without it, the code above creates 5 nested generators.
                if (currentTracker.nameAndLocation() == nameAndLocation) {
                    auto thisTracker = currentTracker.parent().findChild(nameAndLocation);
                    assert(thisTracker);
                    assert(thisTracker->isGeneratorTracker());
                    tracker = std::static_pointer_cast<GeneratorTracker>(thisTracker);
                } else if ( TestCaseTracking::ITrackerPtr childTracker = currentTracker.findChild( nameAndLocation ) ) {
                    assert( childTracker );
                    assert( childTracker->isGeneratorTracker() );
                    tracker = std::static_pointer_cast<GeneratorTracker>( childTracker );
                } else {
                    tracker = std::make_shared<GeneratorTracker>( nameAndLocation, ctx, &currentTracker );
                    currentTracker.addChild( tracker );
                }

                if( !tracker->isComplete() ) {
                    tracker->open();
                }

                return *tracker;
            }